

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

bool __thiscall Gluco::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  lbool *plVar4;
  VarData *pVVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  char *__file;
  uint uVar9;
  char *__assertion;
  long lVar10;
  long lVar11;
  long lVar12;
  Lit p_1;
  Lit local_40;
  Lit local_3c;
  vec<Gluco::Lit> *local_38;
  
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_3c.x = p.x;
  vec<Gluco::Lit>::push(&this->analyze_stack,&local_3c);
  uVar9 = (this->analyze_stack).sz;
  if (0 < (int)uVar9) {
    local_38 = &this->analyze_toclear;
    iVar2 = (this->analyze_toclear).sz;
    lVar12 = (long)iVar2;
    do {
      uVar3 = (this->vardata).data[(this->analyze_stack).data[(ulong)uVar9 - 1].x >> 1].reason;
      if ((ulong)uVar3 == 0xffffffff) {
        __assert_fail("reason(var(analyze_stack.last())) != CRef_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x2c7,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
      }
      if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar3) {
        __assertion = "r >= 0 && r < sz";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
        ;
        pcVar7 = "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]";
LAB_005c2b75:
        __assert_fail(__assertion,__file,0x42,pcVar7);
      }
      puVar1 = (this->ca).super_RegionAllocator<unsigned_int>.memory + uVar3;
      (this->analyze_stack).sz = uVar9 - 1;
      lVar6 = *(long *)puVar1;
      iVar8 = (int)((ulong)lVar6 >> 0x20);
      if (iVar8 == 2) {
        uVar9 = puVar1[3];
        plVar4 = (this->assigns).data;
        if (((byte)uVar9 & 1 ^ plVar4[(int)uVar9 >> 1].value) == 1) {
          uVar3 = puVar1[4];
          if (plVar4[(int)uVar3 >> 1].value != ((byte)uVar3 & 1)) {
            __assert_fail("value(c[1])==l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                          ,0x2ca,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
          }
          puVar1[3] = uVar3;
          puVar1[4] = uVar9;
        }
      }
      if (1 < iVar8) {
        lVar10 = 4;
        do {
          local_40.x = puVar1[lVar10];
          iVar8 = local_40.x >> 1;
          pcVar7 = (this->seen).data;
          if (pcVar7[iVar8] == '\0') {
            pVVar5 = (this->vardata).data;
            uVar9 = pVVar5[iVar8].level;
            if (0 < (int)uVar9) {
              if ((pVVar5[iVar8].reason == 0xffffffff) ||
                 ((abstract_levels >> (uVar9 & 0x1f) & 1) == 0)) {
                iVar8 = (this->analyze_toclear).sz;
                if (iVar2 < iVar8) {
                  do {
                    (this->seen).data[(this->analyze_toclear).data[lVar12].x >> 1] = '\0';
                    lVar12 = lVar12 + 1;
                    iVar8 = (this->analyze_toclear).sz;
                  } while (lVar12 < iVar8);
                }
                if (-1 < iVar2) {
                  if (iVar2 < iVar8) {
                    (this->analyze_toclear).sz = iVar2;
                  }
                  return false;
                }
                __assertion = "nelems <= sz";
                __file = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Vec.h"
                ;
                pcVar7 = "void Gluco::vec<Gluco::Lit>::shrink(int) [T = Gluco::Lit]";
                goto LAB_005c2b75;
              }
              pcVar7[iVar8] = '\x01';
              vec<Gluco::Lit>::push(&this->analyze_stack,&local_40);
              vec<Gluco::Lit>::push(local_38,&local_40);
              lVar6 = *(long *)puVar1;
            }
          }
          lVar11 = lVar10 + -2;
          lVar10 = lVar10 + 1;
        } while (lVar11 < lVar6 >> 0x20);
      }
      uVar9 = (this->analyze_stack).sz;
    } while (0 < (int)uVar9);
  }
  return true;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels)
{
    analyze_stack.clear(); analyze_stack.push(p);
    int top = analyze_toclear.size();
    while (analyze_stack.size() > 0){
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause& c = ca[reason(var(analyze_stack.last()))]; analyze_stack.pop();
        if(c.size()==2 && value(c[0])==l_False) {
          assert(value(c[1])==l_True);
          Lit tmp = c[0];
          c[0] =  c[1], c[1] = tmp;
        }

        for (int i = 1; i < c.size(); i++){
            Lit p  = c[i];
            if (!seen[var(p)] && level(var(p)) > 0){
                if (reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0){
                    seen[var(p)] = 1;
                    analyze_stack.push(p);
                    analyze_toclear.push(p);
                }else{
                    for (int j = top; j < analyze_toclear.size(); j++)
                        seen[var(analyze_toclear[j])] = 0;
                    analyze_toclear.shrink(analyze_toclear.size() - top);
                    return false;
                }
            }
        }
    }

    return true;
}